

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_translation_unit_tree(FILE *out,AST_Translation_Unit *unit)

{
  Queue_Node *pQVar1;
  AST *tree;
  
  for (pQVar1 = (unit->components).first; pQVar1 != (Queue_Node *)0x0; pQVar1 = pQVar1->prev) {
    tree = (AST *)pQVar1->data;
    print_ast(out,tree);
    if (tree->type != ST_FUNCTION_DEFINITION) {
      fwrite(";\n",2,1,(FILE *)out);
    }
  }
  return;
}

Assistant:

void print_translation_unit_tree(FILE *out,struct AST_Translation_Unit *unit)
{
	struct Queue_Node *it;	
	struct AST* hold;
	for(it=unit->components.first;it!=NULL;it=it->prev)
	{
		hold=(struct AST*)(it->data);
		print_ast(out,hold);
		if(hold->type!=ST_FUNCTION_DEFINITION)
		{
			fprintf(out,";\n");
		}
	}
}